

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O2

void do_save_file_proc(Am_Object *cmd)

{
  Am_Object_Method_Type *pAVar1;
  char cVar2;
  Am_Value *pAVar3;
  char *filename;
  Am_Object AStack_28;
  Am_String local_20;
  
  cVar2 = Am_Object::Valid();
  if (cVar2 != '\0') {
    Am_Object::Set(0x620,true,0);
    pAVar3 = (Am_Value *)Am_Object::Get(0x628,0x169);
    Am_String::operator=(&current_filename,pAVar3);
    pAVar3 = (Am_Value *)Am_Object::Get(0x630,0x169);
    Am_String::Am_String(&local_20,pAVar3);
    save_with_examples = (bool)Am_String::operator==(&local_20,&classifier_and_examples);
    Am_String::~Am_String(&local_20);
  }
  cVar2 = Am_String::operator==(&current_filename,"");
  pAVar1 = do_show_save_dialog.Call;
  if (cVar2 == '\0') {
    filename = Am_String::operator_cast_to_char_(&current_filename);
    Save_Trainer(filename,save_with_examples);
    dirty = false;
  }
  else {
    Am_Object::Am_Object(&AStack_28,cmd);
    (*pAVar1)((Am_Object_Data *)&AStack_28);
    Am_Object::~Am_Object(&AStack_28);
  }
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_save_file, (Am_Object cmd))
{
  if (save_dialog.Valid()) {
    save_dialog.Set(Am_VISIBLE, false);
    current_filename = save_dialog_filename.Get(Am_VALUE);
    save_with_examples = (Am_String(save_dialog_format.Get(Am_VALUE)) ==
                          classifier_and_examples);
  }

  if (current_filename == "") {
    do_show_save_dialog.Call(cmd);
    return;
  }

  Save_Trainer(current_filename, save_with_examples);
  dirty = false;
}